

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall capnp::_::PointerBuilder::getCapability(PointerBuilder *this)

{
  CapTableReader *capTable;
  WirePointer *ref;
  undefined8 uVar1;
  undefined8 *in_RSI;
  Own<capnp::ClientHook> OVar2;
  PointerBuilder *this_local;
  
  capTable = (CapTableReader *)*in_RSI;
  ref = (WirePointer *)in_RSI[1];
  uVar1 = in_RSI[2];
  kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  OVar2 = WireHelpers::readCapabilityPointer((SegmentReader *)this,capTable,ref,(int)uVar1);
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> PointerBuilder::getCapability() {
  return WireHelpers::readCapabilityPointer(
      segment, capTable, pointer, kj::maxValue);
}